

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void deqp::gls::BuiltinPrecisionTests::
     ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doPrintValue
               (FloatFormat *fmt,Matrix<float,_4,_2> *value,ostream *os)

{
  bool bVar1;
  bool bVar2;
  char *__s;
  size_t sVar3;
  bool bVar4;
  long lVar5;
  
  __s = glu::getDataTypeName(TYPE_FLOAT_MAT2X4);
  if (__s == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  bVar2 = false;
  lVar5 = 0;
  bVar1 = true;
  do {
    bVar4 = bVar1;
    if (bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
    }
    ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doPrintValue
              (fmt,(value->m_data).m_data + lVar5,os);
    lVar5 = 1;
    bVar2 = true;
    bVar1 = false;
  } while (bVar4);
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  return;
}

Assistant:

static void			doPrintValue	(const FloatFormat& fmt, const T& value, ostream& os)
	{
		os << dataTypeNameOf<T>() << "(";

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
		{
			if (ndx > 0)
				os << ", ";

			printValue<Element>(fmt, value[ndx], os);
		}

		os << ")";
	}